

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::remove_system_handler(Fl_System_Handler ha)

{
  system_handler_link *psVar1;
  system_handler_link *psVar2;
  system_handler_link **ppsVar3;
  
  ppsVar3 = &sys_handlers;
  psVar2 = (system_handler_link *)0x0;
  while( true ) {
    psVar1 = *ppsVar3;
    if (psVar1 == (system_handler_link *)0x0) {
      return;
    }
    if (psVar1->handle == ha) break;
    ppsVar3 = &psVar1->next;
    psVar2 = psVar1;
  }
  ppsVar3 = &sys_handlers;
  if (psVar2 != (system_handler_link *)0x0) {
    ppsVar3 = &psVar2->next;
  }
  *ppsVar3 = psVar1->next;
  operator_delete(psVar1,0x18);
  return;
}

Assistant:

void Fl::remove_system_handler(Fl_System_Handler ha) {
  system_handler_link *l, *p;

  // Search for the handler in the list...
  for (l = sys_handlers, p = 0; l && l->handle != ha; p = l, l = l->next);

  if (l) {
    // Found it, so remove it from the list...
    if (p) p->next = l->next;
    else sys_handlers = l->next;

    // And free the record...
    delete l;
  }
}